

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_filter_lzop.c
# Opt level: O0

int lzop_bidder_bid(archive_read_filter_bidder *self,archive_read_filter *filter)

{
  void *__s1;
  ssize_t avail;
  uchar *p;
  long local_28;
  undefined4 in_stack_fffffffffffffff8;
  undefined4 in_stack_fffffffffffffffc;
  int iVar1;
  
  __s1 = __archive_read_filter_ahead
                   ((archive_read_filter *)p,avail,
                    (ssize_t *)CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8));
  if ((__s1 == (void *)0x0) || (local_28 == 0)) {
    iVar1 = 0;
  }
  else {
    iVar1 = memcmp(__s1,anon_var_dwarf_63d3,9);
    if (iVar1 == 0) {
      iVar1 = 0x48;
    }
    else {
      iVar1 = 0;
    }
  }
  return iVar1;
}

Assistant:

static int
lzop_bidder_bid(struct archive_read_filter_bidder *self,
    struct archive_read_filter *filter)
{
	const unsigned char *p;
	ssize_t avail;

	(void)self; /* UNUSED */

	p = __archive_read_filter_ahead(filter, LZOP_HEADER_MAGIC_LEN, &avail);
	if (p == NULL || avail == 0)
		return (0);

	if (memcmp(p, LZOP_HEADER_MAGIC, LZOP_HEADER_MAGIC_LEN))
		return (0);

	return (LZOP_HEADER_MAGIC_LEN * 8);
}